

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixSetSystemCall(sqlite3_vfs *pNotUsed,char *zName,sqlite3_syscall_ptr pNewFunc)

{
  int iVar1;
  sqlite3_syscall_ptr p_Var2;
  long lVar3;
  long lVar4;
  
  if (zName == (char *)0x0) {
    for (lVar3 = 0x10; lVar3 != 0x2c8; lVar3 = lVar3 + 0x18) {
      lVar4 = *(long *)((long)&aSyscall[0].zName + lVar3);
      if (lVar4 != 0) {
        *(long *)(lVar3 + 0x22b658) = lVar4;
      }
    }
  }
  else {
    lVar3 = -0x10;
    do {
      lVar4 = lVar3;
      if (lVar4 + 0x18 == 0x2c0) {
        return 0xc;
      }
      iVar1 = strcmp(zName,*(char **)((long)&aSyscall[0].pDefault + lVar4));
      lVar3 = lVar4 + 0x18;
    } while (iVar1 != 0);
    p_Var2 = *(sqlite3_syscall_ptr *)((long)&aSyscall[1].pCurrent + lVar4);
    if (p_Var2 == (sqlite3_syscall_ptr)0x0) {
      p_Var2 = *(sqlite3_syscall_ptr *)((long)&aSyscall[1].zName + lVar4);
      *(sqlite3_syscall_ptr *)((long)&aSyscall[1].pCurrent + lVar4) = p_Var2;
    }
    if (pNewFunc != (sqlite3_syscall_ptr)0x0) {
      p_Var2 = pNewFunc;
    }
    *(sqlite3_syscall_ptr *)((long)&aSyscall[1].zName + lVar4) = p_Var2;
  }
  return 0;
}

Assistant:

static int unixSetSystemCall(
  sqlite3_vfs *pNotUsed,        /* The VFS pointer.  Not used */
  const char *zName,            /* Name of system call to override */
  sqlite3_syscall_ptr pNewFunc  /* Pointer to new system call value */
){
  unsigned int i;
  int rc = SQLITE_NOTFOUND;

  UNUSED_PARAMETER(pNotUsed);
  if( zName==0 ){
    /* If no zName is given, restore all system calls to their default
    ** settings and return NULL
    */
    rc = SQLITE_OK;
    for(i=0; i<sizeof(aSyscall)/sizeof(aSyscall[0]); i++){
      if( aSyscall[i].pDefault ){
        aSyscall[i].pCurrent = aSyscall[i].pDefault;
      }
    }
  }else{
    /* If zName is specified, operate on only the one system call
    ** specified.
    */
    for(i=0; i<sizeof(aSyscall)/sizeof(aSyscall[0]); i++){
      if( strcmp(zName, aSyscall[i].zName)==0 ){
        if( aSyscall[i].pDefault==0 ){
          aSyscall[i].pDefault = aSyscall[i].pCurrent;
        }
        rc = SQLITE_OK;
        if( pNewFunc==0 ) pNewFunc = aSyscall[i].pDefault;
        aSyscall[i].pCurrent = pNewFunc;
        break;
      }
    }
  }
  return rc;
}